

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

string_view
google::protobuf::DescriptorPool::ErrorCollector::ErrorLocationName(ErrorLocation location)

{
  string_view sVar1;
  string_view sVar2;
  
  if (location < (OPTION_VALUE|DEFAULT_VALUE)) {
    sVar1._M_str = &DAT_00309e34 + *(int *)(&DAT_00309e34 + (ulong)location * 4);
    sVar1._M_len = *(size_t *)(&DAT_00309e68 + (ulong)location * 8);
    return sVar1;
  }
  sVar2._M_str = "UNKNOWN";
  sVar2._M_len = 7;
  return sVar2;
}

Assistant:

absl::string_view DescriptorPool::ErrorCollector::ErrorLocationName(
    ErrorLocation location) {
  switch (location) {
    case NAME:
      return "NAME";
    case NUMBER:
      return "NUMBER";
    case TYPE:
      return "TYPE";
    case EXTENDEE:
      return "EXTENDEE";
    case DEFAULT_VALUE:
      return "DEFAULT_VALUE";
    case OPTION_NAME:
      return "OPTION_NAME";
    case OPTION_VALUE:
      return "OPTION_VALUE";
    case INPUT_TYPE:
      return "INPUT_TYPE";
    case OUTPUT_TYPE:
      return "OUTPUT_TYPE";
    case IMPORT:
      return "IMPORT";
    case EDITIONS:
      return "EDITIONS";
    case OTHER:
      return "OTHER";
  }
  return "UNKNOWN";
}